

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

vm_obj_id_t __thiscall find_ctx::results_to_list(find_ctx *this)

{
  long lVar1;
  vm_obj_id_t vVar2;
  find_entry_page *pfVar3;
  find_entry *pfVar4;
  size_t idx;
  CVmObjList *this_00;
  uint uVar5;
  int iVar6;
  long lVar7;
  vm_val_t ele;
  vm_val_t local_40;
  
  iVar6 = 0;
  vVar2 = CVmObjList::create(0,(long)this->result_cnt * 2);
  if (0 < this->result_cnt) {
    this_00 = (CVmObjList *)
              ((long)&G_obj_table_X.pages_[vVar2 >> 0xc]->ptr_ + (ulong)((vVar2 & 0xfff) * 0x18));
    pfVar3 = (find_entry_page *)this;
    do {
      pfVar3 = pfVar3->nxt;
      if (iVar6 < this->result_cnt) {
        pfVar4 = pfVar3->entry;
        idx = (long)iVar6 * 2;
        lVar7 = 0;
        do {
          local_40.val.obj = pfVar4->obj;
          local_40.typ = VM_OBJ;
          CVmObjList::cons_set_element(this_00,idx,&local_40);
          CVmObjList::cons_set_element(this_00,idx + 1,&pfVar4->match_result);
          lVar1 = lVar7 + 1;
          if ((long)this->result_cnt <= lVar7 + (long)iVar6 + 1) break;
          idx = idx + 2;
          pfVar4 = pfVar4 + 1;
          uVar5 = (uint)lVar7;
          lVar7 = lVar1;
        } while (uVar5 < 0x1f);
        iVar6 = iVar6 + (int)lVar1;
      }
    } while (iVar6 < this->result_cnt);
  }
  return vVar2;
}

Assistant:

vm_obj_id_t results_to_list(VMG0_)
    {
        vm_obj_id_t lst_id;
        CVmObjList *lst;
        find_entry_page *pg;
        int idx;
        
        /* 
         *   Allocate a list of the appropriate size.  We need two list
         *   entries per result, since we need to store the object and the
         *   match result code for each result.  
         */
        lst_id = CVmObjList::create(vmg_ FALSE, result_cnt * 2);
        lst = (CVmObjList *)vm_objp(vmg_ lst_id);

        /* add all entries */
        for (idx = 0, pg = results_head ; idx < result_cnt ; pg = pg->nxt)
        {
            find_entry *ep;
            int pg_idx;
            
            /* add each entry on this page */
            for (ep = pg->entry, pg_idx = 0 ;
                 idx < result_cnt && pg_idx < FIND_ENTRIES_PER_PAGE ;
                 ++idx, ++pg_idx, ++ep)
            {
                vm_val_t ele;
                    
                /* add this entry to the list */
                ele.set_obj(ep->obj);
                lst->cons_set_element(idx*2, &ele);
                lst->cons_set_element(idx*2 + 1, &ep->match_result);
            }
        }

        /* return the list */
        return lst_id;
    }